

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PelcoD.cpp
# Opt level: O1

void __thiscall
PelcoD::moveTopOnce(PelcoD *this,int panSpeed,int tiltSpeed,
                   vector<char,_std::allocator<char>_> *mess)

{
  value_type *__val;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  
  local_48 = (undefined1 *)0x0;
  puStack_40 = (undefined1 *)0x0;
  local_38 = (undefined1 *)0x0;
  local_48 = (undefined1 *)operator_new(9);
  puStack_40 = local_48 + 9;
  *local_48 = 0;
  *(undefined8 *)(local_48 + 1) = 0;
  local_38 = puStack_40;
  std::vector<char,_std::allocator<char>_>::_M_move_assign(mess,&local_48);
  if (local_48 != (undefined1 *)0x0) {
    operator_delete(local_48,(long)local_38 - (long)local_48);
  }
  *(mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
       = -0x7f;
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [1] = '\x01';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [2] = '\x06';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [3] = '\x01';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [4] = ((char)(uint)((ulong)((long)panSpeed * 0x80808081) >> 0x27) -
        (char)((long)panSpeed * 0x80808081 >> 0x3f)) + (char)panSpeed;
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [5] = ((char)(uint)((ulong)((long)tiltSpeed * 0x80808081) >> 0x27) -
        (char)((long)tiltSpeed * 0x80808081 >> 0x3f)) + (char)tiltSpeed;
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [6] = '\x03';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [7] = '\x01';
  (mess->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
  [8] = -1;
  return;
}

Assistant:

void PelcoD::moveTopOnce(int panSpeed, int tiltSpeed, std::vector<char> &mess)
{
	mess = std::vector<char>(9);
	mess[0] = 0x81;
	mess[1] = 0x01;
	mess[2] = 0x06;
	mess[3] = 0x01;
	mess[4] = panSpeed % 255;
	mess[5] = tiltSpeed % 255;
	mess[6] = 0x03;
	mess[7] = 0x01;
	mess[8] = 0xff;
}